

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void proxy_negotiate(ProxySocket *ps)

{
  char *msg;
  SockAddr *cmp;
  _STACK *p_Var1;
  size_t sVar2;
  ptrlen pVar3;
  void *local_30;
  ptrlen data;
  SockAddr *proxy_addr;
  char *err;
  ProxySocket *ps_local;
  
  if (ps->pn == (ProxyNegotiator *)0x0) {
    __assert_fail("ps->pn",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/proxy.c",
                  0xd3,"void proxy_negotiate(ProxySocket *)");
  }
  proxy_negotiator_process_queue(ps->pn);
  if (ps->pn->error == (char *)0x0) {
    if ((ps->pn->aborted & 1U) == 0) {
      if ((ps->pn->reconnect & 1U) != 0) {
        sk_close(ps->sub_socket);
        cmp = sk_addr_dup(ps->proxy_addr);
        p_Var1 = sk_new((cmp *)cmp);
        ps->sub_socket = (Socket *)p_Var1;
        ps->pn->reconnect = false;
        bufchain_clear(&ps->pending_input_data);
      }
      while (sVar2 = bufchain_size(&ps->output_from_negotiator), sVar2 != 0) {
        pVar3 = bufchain_prefix(&ps->output_from_negotiator);
        local_30 = pVar3.ptr;
        data.ptr = (void *)pVar3.len;
        sk_write(ps->sub_socket,local_30,(size_t)data.ptr);
        bufchain_consume(&ps->output_from_negotiator,(size_t)data.ptr);
      }
      if ((ps->pn->done & 1U) != 0) {
        proxy_activate(ps);
      }
    }
    else {
      proxy_negotiator_cleanup(ps);
      plug_closing_user_abort(ps->plug);
    }
  }
  else {
    msg = dupprintf("Proxy error: %s",ps->pn->error);
    safefree(ps->pn->error);
    proxy_negotiator_cleanup(ps);
    plug_closing_error(ps->plug,msg);
    safefree(msg);
  }
  return;
}

Assistant:

static void proxy_negotiate(ProxySocket *ps)
{
    assert(ps->pn);
    proxy_negotiator_process_queue(ps->pn);

    if (ps->pn->error) {
        char *err = dupprintf("Proxy error: %s", ps->pn->error);
        sfree(ps->pn->error);
        proxy_negotiator_cleanup(ps);
        plug_closing_error(ps->plug, err);
        sfree(err);
        return;
    } else if (ps->pn->aborted) {
        proxy_negotiator_cleanup(ps);
        plug_closing_user_abort(ps->plug);
        return;
    }

    if (ps->pn->reconnect) {
        sk_close(ps->sub_socket);
        SockAddr *proxy_addr = sk_addr_dup(ps->proxy_addr);
        ps->sub_socket = sk_new(proxy_addr, ps->proxy_port,
                                ps->proxy_privport, ps->proxy_oobinline,
                                ps->proxy_nodelay, ps->proxy_keepalive,
                                &ps->plugimpl);
        ps->pn->reconnect = false;
        /* If the negotiator has asked us to reconnect, they are
         * expecting that on the next call their input queue will
         * consist entirely of data from the _new_ connection, without
         * any remaining data buffered from the old one. (If they'd
         * wanted the latter, they could have read it out of the input
         * queue before asking us to close the connection.) */
        bufchain_clear(&ps->pending_input_data);
    }

    while (bufchain_size(&ps->output_from_negotiator)) {
        ptrlen data = bufchain_prefix(&ps->output_from_negotiator);
        sk_write(ps->sub_socket, data.ptr, data.len);
        bufchain_consume(&ps->output_from_negotiator, data.len);
    }
    if (ps->pn->done)
        proxy_activate(ps);
}